

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O3

MultiIndexSet *
TasGrid::MultiIndexManipulations::selectLowerSet<true>
          (MultiIndexSet *__return_storage_ptr__,ProperWeights *weights,
          function<int_(int)> *rule_exactness,int normalized_offset,
          vector<int,_std::allocator<int>_> *level_limits)

{
  size_t sVar1;
  int offset;
  size_t num_dimensions;
  double noff;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  cache;
  size_t local_128;
  double local_120;
  int local_114;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_110;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  undefined1 local_90 [48];
  pointer local_60;
  undefined1 local_50 [16];
  code *local_40;
  
  offset = (int)level_limits;
  local_128 = (long)(weights->linear).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(weights->linear).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  local_114 = normalized_offset;
  if (weights->contour == type_curved) {
    ::std::function<int_(int)>::function
              ((function<int_(int)> *)(local_90 + 0x20),(function<int_(int)> *)rule_exactness);
    generateLevelWeightsCache<double,(TasGrid::TypeDepth)2,false>
              (&local_110,(MultiIndexManipulations *)weights,(ProperWeights *)(local_90 + 0x20),
               (function<int_(int)> *)(ulong)(uint)normalized_offset,offset);
    if (local_60 != (pointer)0x0) {
      (*(code *)local_60)(local_90 + 0x20,local_90 + 0x20,3);
    }
    sVar1 = local_128;
    local_120 = (double)normalized_offset;
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_c8 = (code *)0x0;
    pcStack_c0 = (code *)0x0;
    local_d8._M_unused._M_object = operator_new(0x20);
    *(size_t **)local_d8._M_unused._0_8_ = &local_128;
    *(vector<int,_std::allocator<int>_> **)((long)local_d8._M_unused._0_8_ + 8) = level_limits;
    *(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      **)((long)local_d8._M_unused._0_8_ + 0x10) = &local_110;
    *(double **)((long)local_d8._M_unused._0_8_ + 0x18) = &local_120;
    pcStack_c0 = std::
                 _Function_handler<bool_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgIndexManipulator.cpp:190:17)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<bool_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgIndexManipulator.cpp:190:17)>
               ::_M_manager;
    generateLowerMultiIndexSet
              (__return_storage_ptr__,sVar1,
               (function<bool_(const_std::vector<int,_std::allocator<int>_>_&)> *)&local_d8);
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
  }
  else {
    if (weights->contour == type_level) {
      ::std::function<int_(int)>::function
                ((function<int_(int)> *)local_50,(function<int_(int)> *)rule_exactness);
      generateLevelWeightsCache<int,(TasGrid::TypeDepth)1,false>
                ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&local_110,(MultiIndexManipulations *)weights,(ProperWeights *)local_50,
                 (function<int_(int)> *)(ulong)(uint)normalized_offset,offset);
      if (local_40 != (code *)0x0) {
        (*local_40)(local_50,local_50,3);
      }
      sVar1 = local_128;
      local_b8._M_unused._M_object = (void *)0x0;
      local_b8._8_8_ = 0;
      local_a8 = (code *)0x0;
      pcStack_a0 = (code *)0x0;
      local_b8._M_unused._M_object = operator_new(0x20);
      *(size_t **)local_b8._M_unused._0_8_ = &local_128;
      *(vector<int,_std::allocator<int>_> **)((long)local_b8._M_unused._0_8_ + 8) = level_limits;
      *(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        **)((long)local_b8._M_unused._0_8_ + 0x10) = &local_110;
      *(int **)((long)local_b8._M_unused._0_8_ + 0x18) = &local_114;
      pcStack_a0 = std::
                   _Function_handler<bool_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgIndexManipulator.cpp:182:17)>
                   ::_M_invoke;
      local_a8 = std::
                 _Function_handler<bool_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgIndexManipulator.cpp:182:17)>
                 ::_M_manager;
      generateLowerMultiIndexSet
                (__return_storage_ptr__,sVar1,
                 (function<bool_(const_std::vector<int,_std::allocator<int>_>_&)> *)&local_b8);
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,__destroy_functor);
      }
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_110);
      return __return_storage_ptr__;
    }
    ::std::function<int_(int)>::function
              ((function<int_(int)> *)local_90,(function<int_(int)> *)rule_exactness);
    generateLevelWeightsCache<double,(TasGrid::TypeDepth)3,false>
              (&local_110,(MultiIndexManipulations *)weights,(ProperWeights *)local_90,
               (function<int_(int)> *)(ulong)(uint)normalized_offset,offset);
    if ((code *)local_90._16_8_ != (code *)0x0) {
      (*(code *)local_90._16_8_)(local_90,local_90,3);
    }
    sVar1 = local_128;
    local_120 = (double)normalized_offset;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_e8 = (code *)0x0;
    pcStack_e0 = (code *)0x0;
    local_f8._M_unused._M_object = operator_new(0x20);
    *(size_t **)local_f8._M_unused._0_8_ = &local_128;
    *(vector<int,_std::allocator<int>_> **)((long)local_f8._M_unused._0_8_ + 8) = level_limits;
    *(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      **)((long)local_f8._M_unused._0_8_ + 0x10) = &local_110;
    *(double **)((long)local_f8._M_unused._0_8_ + 0x18) = &local_120;
    pcStack_e0 = std::
                 _Function_handler<bool_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgIndexManipulator.cpp:198:17)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<bool_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgIndexManipulator.cpp:198:17)>
               ::_M_manager;
    generateLowerMultiIndexSet
              (__return_storage_ptr__,sVar1,
               (function<bool_(const_std::vector<int,_std::allocator<int>_>_&)> *)&local_f8);
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
  }
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_110);
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet selectLowerSet(ProperWeights const &weights, std::function<int(int i)> rule_exactness,
                             int normalized_offset, std::vector<int> const &level_limits){
    size_t num_dimensions = weights.getNumDimensions();
    if (weights.contour == type_level){
        auto cache = generateLevelWeightsCache<int, type_level, false>(weights, rule_exactness, normalized_offset);
        return generateLowerMultiIndexSet(num_dimensions,
                [&](std::vector<int> const &index)->bool{
                    if (check_limits) for(size_t j=0; j<num_dimensions; j++) if ((level_limits[j] > -1) && (index[j] > level_limits[j])) return false;
                    return (getIndexWeight<int, type_level>(index.data(), cache) <= normalized_offset);
                });
    }else if (weights.contour == type_curved){
        auto cache = generateLevelWeightsCache<double, type_curved, false>(weights, rule_exactness, normalized_offset);
        double noff = (double) normalized_offset;
        return generateLowerMultiIndexSet(num_dimensions,
                [&](std::vector<int> const &index)->bool{
                    if (check_limits) for(size_t j=0; j<num_dimensions; j++) if ((level_limits[j] > -1) && (index[j] > level_limits[j])) return false;
                    return (std::ceil(getIndexWeight<double, type_curved>(index.data(), cache)) <= noff);
                });
    }else{ // type_hyperbolic
        auto cache = generateLevelWeightsCache<double, type_hyperbolic, false>(weights, rule_exactness, normalized_offset);
        double noff = (double) normalized_offset;
        return generateLowerMultiIndexSet(num_dimensions,
                [&](std::vector<int> const &index)->bool{
                    if (check_limits) for(size_t j=0; j<num_dimensions; j++) if ((level_limits[j] > -1) && (index[j] > level_limits[j])) return false;
                    return (std::ceil(getIndexWeight<double, type_hyperbolic>(index.data(), cache)) <= noff);
                });
    }
}